

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

ostream * operator<<(ostream *lhs,grammar *rhs)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
  *__range1;
  strong_t<int,_grammar::token_tag> *symbol;
  _Base_ptr p_Var7;
  string local_50 [32];
  
  if (operator<<(std::ostream&,grammar_const&)::column == '\0') {
    iVar3 = __cxa_guard_acquire(&operator<<(std::ostream&,grammar_const&)::column);
    if (iVar3 != 0) {
      operator<<::column._M_n = 2;
      __cxa_guard_release(&operator<<(std::ostream&,grammar_const&)::column);
    }
  }
  poVar4 = std::operator<<(lhs,"Symbol mapping (Negative = terminal):");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (p_Var5 = (rhs->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(rhs->symbols)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
    poVar4 = operator<<(lhs,(this_t *)(p_Var5 + 1));
    poVar4 = std::operator<<(poVar4," --> ");
    *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)operator<<::column._M_n;
    poVar4 = operator<<(poVar4,(this_t *)&p_Var5[1]._M_parent);
    std::operator<<(poVar4,'\n');
  }
  poVar4 = std::operator<<(lhs,"Rules:");
  std::endl<char,std::char_traits<char>>(poVar4);
  p_Var1 = &(rhs->rules)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (rhs->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
    poVar4 = operator<<(lhs,(this_t *)(p_Var5 + 1));
    std::operator<<(poVar4," --> ");
    p_Var2 = p_Var5[1]._M_left;
    for (p_Var7 = p_Var5[1]._M_parent; p_Var7 != p_Var2; p_Var7 = (_Base_ptr)&p_Var7->field_0x4) {
      if (p_Var7->_M_color == _S_red) {
        poVar4 = std::operator<<(lhs,' ');
        grammar::rule_sep_char_abi_cxx11_();
        poVar4 = operator<<(poVar4,(this_t *)local_50);
        std::operator<<(poVar4,' ');
        std::__cxx11::string::~string(local_50);
      }
      else {
        *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
        poVar4 = operator<<(lhs,(this_t *)p_Var7);
        std::operator<<(poVar4,' ');
      }
    }
    std::endl<char,std::char_traits<char>>(lhs);
  }
  poVar4 = std::operator<<(lhs,"Rules Prettified:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (p_Var5 = (rhs->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
    pmVar6 = std::
             map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
             ::at(&rhs->symbols,(key_type *)(p_Var5 + 1));
    poVar4 = operator<<(lhs,pmVar6);
    std::operator<<(poVar4," --> ");
    p_Var2 = p_Var5[1]._M_left;
    for (p_Var7 = p_Var5[1]._M_parent; p_Var7 != p_Var2; p_Var7 = (_Base_ptr)&p_Var7->field_0x4) {
      if (p_Var7->_M_color == _S_red) {
        poVar4 = std::operator<<(lhs,' ');
        grammar::rule_sep_char_abi_cxx11_();
        poVar4 = operator<<(poVar4,(this_t *)local_50);
        std::operator<<(poVar4,' ');
        std::__cxx11::string::~string(local_50);
      }
      else {
        *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
        pmVar6 = std::
                 map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
                 ::at(&rhs->symbols,(key_type *)p_Var7);
        poVar4 = operator<<(lhs,pmVar6);
        std::operator<<(poVar4,' ');
      }
    }
    std::endl<char,std::char_traits<char>>(lhs);
  }
  poVar4 = std::endl<char,std::char_traits<char>>(lhs);
  return poVar4;
}

Assistant:

std::ostream & operator<<(std::ostream & lhs, const grammar & rhs) {
    static constexpr auto arrow  = " --> ";
    static const auto     column = std::setw(2);

    lhs << "Symbol mapping (Negative = terminal):" << std::endl;
    for (const auto & entry : rhs.symbols) {
        lhs << column << entry.first << arrow << column << entry.second << '\n';
    }

    lhs << "Rules:" << std::endl;
    for (const auto & entry : rhs.rules) {
        lhs << column << entry.first << arrow;
        for (const auto & symbol : entry.second) {
            if (symbol == grammar::rule_sep)
                lhs << ' ' << grammar::rule_sep_char() << ' ';
            else
                lhs << column << symbol << ' ';
        }
        lhs << std::endl;
    }

    lhs << "Rules Prettified:" << std::endl;
    for (const auto & entry : rhs.rules) {
        lhs << column << rhs.symbols.at(entry.first) << arrow;
        for (const auto & tok : entry.second) {
            if (tok == grammar::rule_sep)
                lhs << ' ' << grammar::rule_sep_char() << ' ';
            else
                lhs << column << rhs.symbols.at(tok) << ' ';
        }
        lhs << std::endl;
    }

    return lhs << std::endl;
}